

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

void thread_proc(void)

{
  bool bVar1;
  log_entry *this;
  reference this_00;
  pointer pIVar2;
  stopped_exception *anon_var_0;
  unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_> *backend;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
  *__range3;
  log_entry *entry;
  
  while (((cancel ^ 0xffU) & 1) != 0) {
    this = log_queue::pop_top(queue);
    if (this != (log_entry *)0x0) {
      __end3 = std::
               vector<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
               ::begin(&backends);
      backend = (unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_> *)
                std::
                vector<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
                ::end(&backends);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_*,_std::vector<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>_>
                                         *)&backend), bVar1) {
        this_00 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_*,_std::vector<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>_>
                  ::operator*(&__end3);
        switch(this->level) {
        case verbose:
          pIVar2 = std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>
                   ::operator->(this_00);
          (*pIVar2->_vptr_IBackend[2])(pIVar2,&this->tag,&this->message);
          break;
        case info:
          pIVar2 = std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>
                   ::operator->(this_00);
          (*pIVar2->_vptr_IBackend[3])(pIVar2,&this->tag,&this->message);
          break;
        case warning:
          pIVar2 = std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>
                   ::operator->(this_00);
          (*pIVar2->_vptr_IBackend[4])(pIVar2,&this->tag,&this->message);
          break;
        case error:
          pIVar2 = std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>
                   ::operator->(this_00);
          (*pIVar2->_vptr_IBackend[2])(pIVar2,&this->tag,&this->message);
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_*,_std::vector<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>_>
        ::operator++(&__end3);
      }
      if (this != (log_entry *)0x0) {
        log_queue::log_entry::~log_entry(this);
        operator_delete(this,0x48);
      }
    }
  }
  return;
}

Assistant:

static void thread_proc() {
    try {
        while (!cancel) {
            log_queue::log_entry* entry = queue->pop_top();
            if (entry) {
                for (auto& backend : backends) {
                    switch (entry->level) {
                        case debug_level::verbose:
                            backend->verbose(entry->tag, entry->message);
                            break;
                        case debug_level::info:
                            backend->info(entry->tag, entry->message);
                            break;
                        case debug_level::warning:
                            backend->warning(entry->tag, entry->message);
                            break;
                        case debug_level::error:
                            backend->verbose(entry->tag, entry->message);
                            break;
                    }
                }
                delete entry;
            }
        }
    }
    catch (log_queue::stopped_exception&) {
    }
}